

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O3

void __thiscall
KokkosTools::SpaceTimeStack::Allocations::allocate
          (Allocations *this,string *name,void *ptr,uint64_t size,StackNode *frame)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pair<std::_Rb_tree_iterator<KokkosTools::SpaceTimeStack::Allocation>,_bool> pVar3;
  Allocation local_58;
  
  if (ptr == (void *)0x0) {
    if (size != 0) {
      __assert_fail("size == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/space-time-stack/kp_space_time_stack.cpp"
                    ,0x20d,
                    "void KokkosTools::SpaceTimeStack::Allocations::allocate(std::string &&, const void *, std::uint64_t, StackNode *)"
                   );
    }
  }
  else {
    paVar2 = &local_58.name.field_2;
    local_58.name._M_dataplus._M_p = (name->_M_dataplus)._M_p;
    paVar1 = &name->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.name._M_dataplus._M_p == paVar1) {
      local_58.name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_58.name.field_2._8_8_ = *(undefined8 *)((long)&name->field_2 + 8);
      local_58.name._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_58.name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_58.name._M_string_length = name->_M_string_length;
    (name->_M_dataplus)._M_p = (pointer)paVar1;
    name->_M_string_length = 0;
    (name->field_2)._M_local_buf[0] = '\0';
    local_58.ptr = ptr;
    local_58.size = size;
    local_58.frame = frame;
    pVar3 = std::
            _Rb_tree<KokkosTools::SpaceTimeStack::Allocation,_KokkosTools::SpaceTimeStack::Allocation,_std::_Identity<KokkosTools::SpaceTimeStack::Allocation>,_std::less<KokkosTools::SpaceTimeStack::Allocation>,_std::allocator<KokkosTools::SpaceTimeStack::Allocation>_>
            ::_M_emplace_unique<KokkosTools::SpaceTimeStack::Allocation>
                      (&(this->alloc_set)._M_t,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.name._M_dataplus._M_p != paVar2) {
      operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1
                     );
    }
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __assert_fail("res.second",
                    "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/space-time-stack/kp_space_time_stack.cpp"
                    ,0x211,
                    "void KokkosTools::SpaceTimeStack::Allocations::allocate(std::string &&, const void *, std::uint64_t, StackNode *)"
                   );
    }
    this->total_size = this->total_size + size;
  }
  return;
}

Assistant:

void allocate(std::string&& name, const void* ptr, std::uint64_t size,
                StackNode* frame) {
    if (ptr == nullptr) {
      assert(size == 0);
      return;
    }
    auto res = alloc_set.emplace(Allocation(std::move(name), ptr, size, frame));
    assert(res.second);
    total_size += size;
  }